

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O1

void __thiscall
ExprTest_HashNumericVarArgExpr_Test::TestBody(ExprTest_HashNumericVarArgExpr_Test *this)

{
  ExprFactory *this_00;
  IteratedExpr IVar1;
  NumericExpr args [3];
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_38;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_30;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_28;
  
  this_00 = &(this->super_ExprTest).factory_;
  local_38.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeReference(this_00,FIRST_REFERENCE,0);
  local_30.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeReference(this_00,FIRST_REFERENCE,1);
  local_28.super_ExprBase.impl_ =
       (ExprBase)mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,42.0);
  IVar1 = ExprTest::MakeIterated<3>
                    (&this->super_ExprTest,FIRST_ITERATED,(NumericExpr (*) [3])&local_38);
  CheckHash<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
            ((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
              )IVar1.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_);
  IVar1 = ExprTest::MakeIterated<3>(&this->super_ExprTest,SUM,(NumericExpr (*) [3])&local_38);
  CheckHash<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
            ((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
              )IVar1.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_);
  IVar1 = ExprTest::MakeIterated<3>
                    (&this->super_ExprTest,LAST_ITERATED,(NumericExpr (*) [3])&local_38);
  CheckHash<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
            ((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
              )IVar1.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_);
  return;
}

Assistant:

TEST_F(ExprTest, HashNumericVarArgExpr) {
  // Test computing hash for numeric expressions with abitrary numeric
  // arguments: VarArgExpr, SumExpr, NumberOfExpr.
  NumericExpr args[] = { MakeVariable(0), MakeVariable(1), MakeConst(42)};
  CheckHash(MakeIterated(expr::MIN, args));
  CheckHash(MakeIterated(expr::SUM, args));
  CheckHash(MakeIterated(expr::NUMBEROF, args));
}